

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamout_array.hpp
# Opt level: O3

BOOL __thiscall ByteStreamOutArray::putByte(ByteStreamOutArray *this,U8 byte)

{
  U8 *pUVar1;
  long lVar2;
  
  lVar2 = this->curr;
  if (lVar2 == this->alloc) {
    this->alloc = lVar2 + 0x1000U;
    pUVar1 = (U8 *)realloc_las(this->data,lVar2 + 0x1000U & 0xffffffff);
    this->data = pUVar1;
    if (pUVar1 == (U8 *)0x0) {
      return false;
    }
    lVar2 = this->curr;
  }
  else {
    pUVar1 = this->data;
  }
  pUVar1[lVar2] = byte;
  lVar2 = this->curr + 1;
  if (this->curr == this->size) {
    this->size = lVar2;
  }
  this->curr = lVar2;
  return true;
}

Assistant:

inline BOOL ByteStreamOutArray::putByte(U8 byte)
{
  if (curr == alloc)
  {
    alloc += 4096;
    data = (U8*)realloc_las(data, (U32)alloc);
    if (data == 0)
    {
      return FALSE;
    }
  }
  data[curr] = byte;
  if (curr == size) size++;
  curr++;
  return TRUE;
}